

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O2

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32_t m [16];
  uint local_118 [8];
  uint local_f8 [24];
  int local_98 [26];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_98[lVar1] = *(int *)(in + lVar1 * 4);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_118[lVar1] = S->h[lVar1];
  }
  uVar2 = local_118[0] + local_118[4] + local_98[0];
  uVar3 = uVar2 ^ S->t[0] ^ 0x510e527f;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  uVar4 = uVar3 + 0x6a09e667 ^ local_118[4];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar6 = local_98[1] + uVar2 + uVar4;
  uVar2 = uVar6 ^ uVar3;
  uVar10 = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[0] = uVar10 + uVar3 + 0x6a09e667;
  uVar4 = uVar4 ^ local_f8[0];
  uVar5 = uVar4 << 0x19 | uVar4 >> 7;
  uVar3 = local_118[1] + local_118[5] + local_98[2];
  uVar2 = S->t[1] ^ uVar3 ^ 0x9b05688c;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  uVar4 = uVar2 + 0xbb67ae85 ^ local_118[5];
  uVar12 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar3 = uVar3 + local_98[3] + uVar12;
  uVar4 = uVar3 ^ uVar2;
  uVar8 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[1] = uVar2 + uVar8 + 0xbb67ae85;
  uVar12 = uVar12 ^ local_f8[1];
  uVar13 = uVar12 << 0x19 | uVar12 >> 7;
  uVar14 = local_118[2] + local_118[6] + local_98[4];
  uVar2 = S->f[0] ^ uVar14 ^ 0x1f83d9ab;
  uVar9 = uVar2 << 0x10 | uVar2 >> 0x10;
  uVar4 = uVar9 + 0x3c6ef372 ^ local_118[6];
  uVar11 = local_118[3] + local_118[7] + local_98[6];
  uVar2 = S->f[1] ^ uVar11 ^ 0x5be0cd19;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  uVar7 = uVar2 + 0xa54ff53a ^ local_118[7];
  uVar12 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar15 = uVar14 + local_98[5] + uVar12;
  uVar4 = uVar15 ^ uVar9;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[2] = uVar4 + uVar9 + 0x3c6ef372;
  uVar12 = uVar12 ^ local_f8[2];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar7 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar11 = uVar11 + local_98[7] + uVar7;
  uVar9 = uVar11 ^ uVar2;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[3] = uVar2 + uVar9 + 0xa54ff53a;
  uVar7 = uVar7 ^ local_f8[3];
  uVar7 = uVar7 << 0x19 | uVar7 >> 7;
  uVar2 = uVar6 + local_98[8] + uVar13;
  uVar9 = uVar9 ^ uVar2;
  uVar6 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[2] = local_f8[2] + uVar6;
  uVar13 = uVar13 ^ local_f8[2];
  uVar9 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_98[9] + uVar9;
  uVar6 = uVar6 ^ uVar2;
  uVar13 = uVar6 << 0x18 | uVar6 >> 8;
  local_f8[2] = local_f8[2] + uVar13;
  uVar9 = uVar9 ^ local_f8[2];
  uVar14 = uVar9 << 0x19 | uVar9 >> 7;
  uVar3 = uVar3 + local_98[10] + uVar12;
  uVar10 = uVar10 ^ uVar3;
  uVar9 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[3] = local_f8[3] + uVar9;
  uVar12 = uVar12 ^ local_f8[3];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar3 = uVar3 + local_98[0xb] + uVar6;
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[3] = local_f8[3] + uVar9;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar10 = uVar15 + local_98[0xc] + uVar7;
  uVar8 = uVar8 ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[0] = local_f8[0] + uVar8;
  uVar7 = uVar7 ^ local_f8[0];
  uVar12 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar15 = uVar10 + local_98[0xd] + uVar12;
  uVar8 = uVar8 ^ uVar15;
  uVar7 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[0] = local_f8[0] + uVar7;
  uVar12 = uVar12 ^ local_f8[0];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar8 = uVar11 + local_98[0xe] + uVar5;
  uVar4 = uVar4 ^ uVar8;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[1] = local_f8[1] + uVar4;
  uVar5 = uVar5 ^ local_f8[1];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar8 + local_98[0xf] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[1] = local_f8[1] + uVar4;
  uVar5 = uVar5 ^ local_f8[1];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + local_98[0xe] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar8 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[0] = local_f8[0] + uVar8;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_98[10] + uVar5;
  uVar8 = uVar8 ^ uVar2;
  uVar9 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[0] = local_f8[0] + uVar9;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + local_98[4] + uVar14;
  uVar7 = uVar7 ^ uVar3;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[1] = local_f8[1] + uVar7;
  uVar14 = uVar14 ^ local_f8[1];
  uVar8 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar3 = uVar3 + local_98[8] + uVar8;
  uVar7 = uVar7 ^ uVar3;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[1] = local_f8[1] + uVar7;
  uVar8 = uVar8 ^ local_f8[1];
  uVar14 = uVar8 << 0x19 | uVar8 >> 7;
  uVar8 = uVar15 + local_98[9] + uVar6;
  uVar4 = uVar4 ^ uVar8;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[2] = local_f8[2] + uVar4;
  uVar6 = uVar6 ^ local_f8[2];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar8 + local_98[0xf] + uVar6;
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[2] = local_f8[2] + uVar4;
  uVar6 = uVar6 ^ local_f8[2];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar10 + local_98[0xd] + uVar12;
  uVar13 = uVar13 ^ uVar8;
  uVar11 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[3] = local_f8[3] + uVar11;
  uVar12 = uVar12 ^ local_f8[3];
  uVar12 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar10 = uVar8 + local_98[6] + uVar12;
  uVar11 = uVar11 ^ uVar10;
  uVar8 = uVar11 << 0x18 | uVar11 >> 8;
  local_f8[3] = local_f8[3] + uVar8;
  uVar12 = uVar12 ^ local_f8[3];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar2 = uVar2 + local_98[1] + uVar14;
  uVar8 = uVar8 ^ uVar2;
  uVar11 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[2] = local_f8[2] + uVar11;
  uVar14 = uVar14 ^ local_f8[2];
  uVar13 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar8 = uVar2 + local_98[0xc] + uVar13;
  uVar11 = uVar11 ^ uVar8;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_f8[2] = local_f8[2] + uVar11;
  uVar13 = uVar13 ^ local_f8[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar3 + local_98[0] + uVar6;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[3] = local_f8[3] + uVar9;
  uVar6 = uVar6 ^ local_f8[3];
  uVar3 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar2 = uVar2 + local_98[2] + uVar3;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[3] = local_f8[3] + uVar9;
  uVar3 = uVar3 ^ local_f8[3];
  uVar6 = uVar3 << 0x19 | uVar3 >> 7;
  uVar14 = uVar15 + local_98[0xb] + uVar12;
  uVar7 = uVar7 ^ uVar14;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[0] = local_f8[0] + uVar7;
  uVar12 = uVar12 ^ local_f8[0];
  uVar3 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar14 = uVar14 + local_98[7] + uVar3;
  uVar7 = uVar7 ^ uVar14;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[0] = local_f8[0] + uVar7;
  uVar3 = uVar3 ^ local_f8[0];
  uVar12 = uVar3 << 0x19 | uVar3 >> 7;
  uVar10 = uVar10 + local_98[5] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar3 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar5 = uVar5 ^ local_f8[1];
  uVar4 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar10 + local_98[3] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar5 = uVar8 + local_98[0xb] + uVar4;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[0] = local_f8[0] + uVar9;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar8 = uVar5 + local_98[8] + uVar4;
  uVar9 = uVar9 ^ uVar8;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[0] = local_f8[0] + uVar9;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_98[0xc] + uVar13;
  uVar7 = uVar7 ^ uVar2;
  uVar5 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[1] = local_f8[1] + uVar5;
  uVar13 = uVar13 ^ local_f8[1];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_98[0] + uVar13;
  uVar5 = uVar5 ^ uVar2;
  uVar7 = uVar5 << 0x18 | uVar5 >> 8;
  local_f8[1] = local_f8[1] + uVar7;
  uVar13 = uVar13 ^ local_f8[1];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar14 = uVar14 + local_98[5] + uVar6;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[2] = local_f8[2] + uVar3;
  uVar6 = uVar6 ^ local_f8[2];
  uVar5 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar14 + local_98[2] + uVar5;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[2] = local_f8[2] + uVar3;
  uVar5 = uVar5 ^ local_f8[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar10 = uVar10 + local_98[0xf] + uVar12;
  uVar11 = uVar11 ^ uVar10;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[3] = local_f8[3] + uVar11;
  uVar12 = uVar12 ^ local_f8[3];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar10 = uVar10 + local_98[0xd] + uVar6;
  uVar11 = uVar11 ^ uVar10;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_f8[3] = local_f8[3] + uVar11;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar12 = uVar8 + local_98[10] + uVar13;
  uVar11 = uVar11 ^ uVar12;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[2] = local_f8[2] + uVar11;
  uVar13 = uVar13 ^ local_f8[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar8 = uVar12 + local_98[0xe] + uVar13;
  uVar11 = uVar11 ^ uVar8;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_f8[2] = local_f8[2] + uVar11;
  uVar13 = uVar13 ^ local_f8[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar2 + local_98[3] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar12 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[3] = local_f8[3] + uVar12;
  uVar5 = uVar5 ^ local_f8[3];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_98[6] + uVar5;
  uVar12 = uVar12 ^ uVar2;
  uVar9 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[3] = local_f8[3] + uVar9;
  uVar5 = uVar5 ^ local_f8[3];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar14 = uVar14 + local_98[7] + uVar6;
  uVar7 = uVar7 ^ uVar14;
  uVar12 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar14 + local_98[1] + uVar6;
  uVar12 = uVar12 ^ uVar14;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar10 + local_98[9] + uVar4;
  uVar3 = uVar3 ^ uVar7;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar10 = uVar7 + local_98[4] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar7 = uVar8 + local_98[7] + uVar4;
  uVar9 = uVar9 ^ uVar7;
  uVar8 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[0] = local_f8[0] + uVar8;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar7 = uVar7 + local_98[9] + uVar4;
  uVar8 = uVar8 ^ uVar7;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[0] = local_f8[0] + uVar8;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_98[3] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[1] = local_f8[1] + uVar12;
  uVar13 = uVar13 ^ local_f8[1];
  uVar9 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_98[1] + uVar9;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[1] = local_f8[1] + uVar12;
  uVar9 = uVar9 ^ local_f8[1];
  uVar13 = uVar9 << 0x19 | uVar9 >> 7;
  uVar9 = uVar14 + local_98[0xd] + uVar5;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[2] = local_f8[2] + uVar3;
  uVar5 = uVar5 ^ local_f8[2];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar14 = uVar9 + local_98[0xc] + uVar5;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[2] = local_f8[2] + uVar3;
  uVar5 = uVar5 ^ local_f8[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar9 = uVar10 + local_98[0xb] + uVar6;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[3] = local_f8[3] + uVar10;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar9 = uVar9 + local_98[0xe] + uVar6;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 << 0x18 | uVar10 >> 8;
  local_f8[3] = local_f8[3] + uVar10;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar7 + local_98[2] + uVar13;
  uVar10 = uVar10 ^ uVar7;
  uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[2] = local_f8[2] + uVar10;
  uVar13 = uVar13 ^ local_f8[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar7 + local_98[6] + uVar13;
  uVar10 = uVar10 ^ uVar7;
  uVar11 = uVar10 << 0x18 | uVar10 >> 8;
  local_f8[2] = local_f8[2] + uVar11;
  uVar13 = uVar13 ^ local_f8[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar2 + local_98[5] + uVar5;
  uVar8 = uVar8 ^ uVar2;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[3] = local_f8[3] + uVar8;
  uVar5 = uVar5 ^ local_f8[3];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_98[10] + uVar5;
  uVar8 = uVar8 ^ uVar2;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[3] = local_f8[3] + uVar8;
  uVar5 = uVar5 ^ local_f8[3];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar10 = uVar14 + local_98[4] + uVar6;
  uVar12 = uVar12 ^ uVar10;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar10 + local_98[0] + uVar6;
  uVar12 = uVar12 ^ uVar15;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar9 = uVar9 + local_98[0xf] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar10 = uVar9 + local_98[8] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar7 = uVar7 + local_98[9] + uVar4;
  uVar8 = uVar8 ^ uVar7;
  uVar9 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[0] = local_f8[0] + uVar9;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar8 = uVar7 + local_98[0] + uVar4;
  uVar9 = uVar9 ^ uVar8;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[0] = local_f8[0] + uVar9;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_98[5] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[1] = local_f8[1] + uVar12;
  uVar13 = uVar13 ^ local_f8[1];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_98[7] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar7 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[1] = local_f8[1] + uVar7;
  uVar13 = uVar13 ^ local_f8[1];
  uVar14 = uVar13 << 0x19 | uVar13 >> 7;
  uVar12 = uVar15 + local_98[2] + uVar5;
  uVar3 = uVar3 ^ uVar12;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[2] = local_f8[2] + uVar3;
  uVar5 = uVar5 ^ local_f8[2];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar10 + local_98[10] + uVar6;
  uVar11 = uVar11 ^ uVar10;
  uVar15 = uVar12 + local_98[4] + uVar5;
  uVar3 = uVar3 ^ uVar15;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[2] = local_f8[2] + uVar3;
  uVar5 = uVar5 ^ local_f8[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar13 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[3] = local_f8[3] + uVar13;
  uVar6 = uVar6 ^ local_f8[3];
  uVar12 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar11 = uVar10 + local_98[0xf] + uVar12;
  uVar13 = uVar13 ^ uVar11;
  uVar10 = uVar13 << 0x18 | uVar13 >> 8;
  local_f8[3] = local_f8[3] + uVar10;
  uVar12 = uVar12 ^ local_f8[3];
  uVar6 = uVar8 + local_98[0xe] + uVar14;
  uVar10 = uVar10 ^ uVar6;
  uVar13 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[2] = local_f8[2] + uVar13;
  uVar14 = uVar14 ^ local_f8[2];
  uVar14 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar8 = uVar6 + local_98[1] + uVar14;
  uVar13 = uVar13 ^ uVar8;
  uVar2 = uVar2 + local_98[0xb] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[3] = local_f8[3] + uVar9;
  uVar5 = uVar5 ^ local_f8[3];
  uVar6 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_98[0xc] + uVar6;
  uVar9 = uVar9 ^ uVar2;
  uVar10 = uVar9 << 0x18 | uVar9 >> 8;
  uVar9 = uVar11 + local_98[3] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar4 = uVar4 ^ local_f8[1];
  uVar5 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar11 = uVar9 + local_98[0xd] + uVar5;
  uVar3 = uVar3 ^ uVar11;
  uVar4 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[1] + uVar4;
  uVar5 = uVar5 ^ local_f8[1];
  uVar3 = uVar5 << 0x19 | uVar5 >> 7;
  local_f8[3] = local_f8[3] + uVar10;
  uVar9 = uVar8 + local_98[2] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar5 = uVar12 << 0x19 | uVar12 >> 7;
  uVar13 = uVar13 << 0x18 | uVar13 >> 8;
  local_f8[2] = local_f8[2] + uVar13;
  uVar14 = uVar14 ^ local_f8[2];
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar8 = uVar15 + local_98[6] + uVar5;
  uVar7 = uVar7 ^ uVar8;
  uVar12 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[0] = local_f8[0] + uVar12;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar7 = uVar8 + local_98[8] + uVar5;
  uVar12 = uVar12 ^ uVar7;
  uVar8 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[0] = local_f8[0] + uVar8;
  uVar2 = uVar2 + local_98[6] + uVar14;
  uVar8 = uVar8 ^ uVar2;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar15 = uVar7 + local_98[0] + uVar6;
  uVar4 = uVar4 ^ uVar15;
  uVar5 = uVar5 ^ local_f8[0];
  uVar7 = uVar5 << 0x19 | uVar5 >> 7;
  uVar11 = uVar11 + local_98[8] + uVar7;
  uVar13 = uVar13 ^ uVar11;
  uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[0] = local_f8[0] + uVar10;
  uVar3 = uVar3 ^ local_f8[0];
  uVar5 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar12 = uVar9 + local_98[0xc] + uVar5;
  uVar10 = uVar10 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[1] = local_f8[1] + uVar8;
  uVar14 = uVar14 ^ local_f8[1];
  uVar9 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar3 = uVar2 + local_98[10] + uVar9;
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[1] = local_f8[1] + uVar8;
  uVar9 = uVar9 ^ local_f8[1];
  uVar14 = uVar9 << 0x19 | uVar9 >> 7;
  uVar2 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[3] = local_f8[3] + uVar2;
  uVar7 = uVar7 ^ local_f8[3];
  uVar7 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar13 = uVar11 + local_98[3] + uVar7;
  uVar2 = uVar2 ^ uVar13;
  uVar9 = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[3] = local_f8[3] + uVar9;
  uVar12 = uVar12 + local_98[4] + uVar14;
  uVar9 = uVar9 ^ uVar12;
  uVar2 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[2] = local_f8[2] + uVar2;
  uVar6 = uVar6 ^ local_f8[2];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar15 + local_98[0xb] + uVar6;
  uVar2 = uVar2 ^ uVar15;
  uVar4 = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[2] = local_f8[2] + uVar4;
  uVar6 = uVar6 ^ local_f8[2];
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[2] = local_f8[2] + uVar9;
  uVar14 = uVar14 ^ local_f8[2];
  uVar14 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar2 = uVar12 + local_98[0xd] + uVar14;
  uVar9 = uVar9 ^ uVar2;
  uVar11 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[2] = uVar11 + local_f8[2];
  uVar12 = uVar10 << 0x18 | uVar10 >> 8;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar7 ^ local_f8[3];
  uVar14 = uVar14 ^ local_f8[2];
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar3 = uVar3 + uVar6 + local_98[7];
  uVar12 = uVar12 ^ uVar3;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[3] = local_f8[3] + uVar12;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar3 = uVar3 + local_98[5] + uVar6;
  uVar12 = uVar12 ^ uVar3;
  uVar9 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[3] = local_f8[3] + uVar9;
  uVar6 = local_f8[3] ^ uVar6;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar12 = uVar7 << 0x19 | uVar7 >> 7;
  uVar7 = uVar13 + local_98[1] + uVar5;
  uVar4 = uVar4 ^ uVar7;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[1] = local_f8[1] + uVar4;
  uVar5 = uVar5 ^ local_f8[1];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar15 = uVar15 + local_98[0xf] + uVar12;
  uVar13 = uVar7 + uVar5 + local_98[9];
  uVar8 = uVar8 ^ uVar15;
  uVar4 = uVar4 ^ uVar13;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[1] = local_f8[1] + uVar4;
  uVar5 = uVar5 ^ local_f8[1];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + local_98[0xc] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar10 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[0] = local_f8[0] + uVar7;
  uVar12 = uVar12 ^ local_f8[0];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar15 = uVar15 + local_98[0xe] + uVar6;
  uVar7 = uVar7 ^ uVar15;
  uVar12 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[0] = local_f8[0] + uVar7;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_98[5] + uVar5;
  uVar7 = uVar7 ^ uVar2;
  uVar9 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[0] = uVar9 + local_f8[0];
  uVar5 = local_f8[0] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + uVar14 + local_98[1];
  uVar12 = uVar12 ^ uVar3;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[1] = local_f8[1] + uVar12;
  uVar14 = uVar14 ^ local_f8[1];
  uVar8 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar3 = uVar3 + local_98[0xf] + uVar8;
  uVar12 = uVar12 ^ uVar3;
  uVar7 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[1] = uVar7 + local_f8[1];
  uVar8 = local_f8[1] ^ uVar8;
  uVar12 = uVar8 << 0x19 | uVar8 >> 7;
  uVar14 = uVar15 + uVar10 + local_98[0xe];
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[2] = local_f8[2] + uVar4;
  uVar10 = uVar10 ^ local_f8[2];
  uVar8 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar15 = uVar14 + uVar8 + local_98[0xd];
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[2] = uVar4 + local_f8[2];
  uVar8 = uVar8 ^ local_f8[2];
  uVar10 = uVar8 << 0x19 | uVar8 >> 7;
  uVar13 = uVar13 + uVar6 + local_98[4];
  uVar11 = uVar11 ^ uVar13;
  uVar8 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[3] = local_f8[3] + uVar8;
  uVar6 = uVar6 ^ local_f8[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar13 + uVar6 + local_98[10];
  uVar8 = uVar8 ^ uVar14;
  uVar11 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[3] = local_f8[3] + uVar11;
  uVar6 = uVar6 ^ local_f8[3];
  uVar8 = uVar6 << 0x19 | uVar6 >> 7;
  uVar2 = uVar2 + uVar12 + local_98[0];
  uVar11 = uVar11 ^ uVar2;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[2] = local_f8[2] + uVar11;
  uVar12 = uVar12 ^ local_f8[2];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar2 = uVar2 + uVar6 + local_98[7];
  uVar11 = uVar11 ^ uVar2;
  uVar13 = uVar11 << 0x18 | uVar11 >> 8;
  local_f8[2] = uVar13 + local_f8[2];
  uVar6 = local_f8[2] ^ uVar6;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar3 = uVar3 + uVar10 + local_98[6];
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[3] = local_f8[3] + uVar9;
  uVar10 = uVar10 ^ local_f8[3];
  uVar12 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar3 = uVar3 + uVar12 + local_98[3];
  uVar9 = uVar9 ^ uVar3;
  uVar10 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[3] = local_f8[3] + uVar10;
  uVar12 = local_f8[3] ^ uVar12;
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar9 = uVar15 + uVar8 + local_98[9];
  uVar7 = uVar7 ^ uVar9;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[0] = local_f8[0] + uVar7;
  uVar8 = uVar8 ^ local_f8[0];
  uVar8 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar15 = uVar9 + uVar8 + local_98[2];
  uVar7 = uVar7 ^ uVar15;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[0] = local_f8[0] + uVar7;
  uVar8 = uVar8 ^ local_f8[0];
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar11 = uVar14 + uVar5 + local_98[8];
  uVar4 = uVar4 ^ uVar11;
  uVar9 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[1] = local_f8[1] + uVar9;
  uVar5 = uVar5 ^ local_f8[1];
  uVar4 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar14 = uVar11 + local_98[0xb] + uVar4;
  uVar9 = uVar9 ^ uVar14;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[1] = local_f8[1] + uVar9;
  uVar4 = uVar4 ^ local_f8[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + uVar4 + local_98[0xd];
  uVar10 = uVar10 ^ uVar2;
  uVar5 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[0] = local_f8[0] + uVar5;
  uVar4 = uVar4 ^ local_f8[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar2 = uVar2 + local_98[0xb] + uVar4;
  uVar5 = uVar5 ^ uVar2;
  uVar10 = uVar5 << 0x18 | uVar5 >> 8;
  local_f8[0] = uVar10 + local_f8[0];
  uVar4 = local_f8[0] ^ uVar4;
  uVar11 = uVar4 << 0x19 | uVar4 >> 7;
  uVar3 = uVar3 + uVar6 + local_98[7];
  uVar7 = uVar7 ^ uVar3;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[1] = local_f8[1] + uVar7;
  uVar6 = uVar6 ^ local_f8[1];
  uVar5 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar4 = uVar3 + uVar5 + local_98[0xe];
  uVar7 = uVar7 ^ uVar4;
  uVar6 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[1] = uVar6 + local_f8[1];
  uVar5 = local_f8[1] ^ uVar5;
  uVar3 = uVar5 << 0x19 | uVar5 >> 7;
  uVar15 = uVar15 + uVar12 + local_98[0xc];
  uVar9 = uVar9 ^ uVar15;
  uVar5 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[2] = local_f8[2] + uVar5;
  uVar12 = uVar12 ^ local_f8[2];
  uVar7 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar16 = uVar15 + uVar7 + local_98[1];
  uVar5 = uVar5 ^ uVar16;
  uVar12 = uVar5 << 0x18 | uVar5 >> 8;
  local_f8[2] = uVar12 + local_f8[2];
  uVar7 = uVar7 ^ local_f8[2];
  uVar9 = uVar7 << 0x19 | uVar7 >> 7;
  uVar14 = uVar14 + uVar8 + local_98[3];
  uVar13 = uVar13 ^ uVar14;
  uVar7 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[3] = local_f8[3] + uVar7;
  uVar8 = uVar8 ^ local_f8[3];
  uVar5 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar15 = uVar14 + uVar5 + local_98[9];
  uVar7 = uVar7 ^ uVar15;
  uVar8 = uVar7 << 0x18 | uVar7 >> 8;
  local_f8[3] = local_f8[3] + uVar8;
  uVar5 = uVar5 ^ local_f8[3];
  uVar7 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + uVar3 + local_98[5];
  uVar8 = uVar8 ^ uVar2;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[2] = local_f8[2] + uVar8;
  uVar3 = uVar3 ^ local_f8[2];
  uVar5 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar3 = uVar2 + uVar5 + local_98[0];
  uVar8 = uVar8 ^ uVar3;
  uVar14 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[2] = uVar14 + local_f8[2];
  uVar5 = local_f8[2] ^ uVar5;
  uVar2 = uVar5 << 0x19 | uVar5 >> 7;
  uVar4 = uVar4 + local_98[0xf] + uVar9;
  uVar10 = uVar10 ^ uVar4;
  uVar8 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[3] = local_f8[3] + uVar8;
  uVar9 = uVar9 ^ local_f8[3];
  uVar5 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar4 = uVar4 + uVar5 + local_98[4];
  uVar8 = uVar8 ^ uVar4;
  uVar13 = uVar8 << 0x18 | uVar8 >> 8;
  local_f8[3] = local_f8[3] + uVar13;
  uVar5 = local_f8[3] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar9 = uVar16 + uVar7 + local_98[8];
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_f8[0] = local_f8[0] + uVar6;
  uVar7 = uVar7 ^ local_f8[0];
  uVar8 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar16 = uVar9 + local_98[6] + uVar8;
  uVar6 = uVar6 ^ uVar16;
  uVar7 = uVar6 << 0x18 | uVar6 >> 8;
  local_f8[0] = local_f8[0] + uVar7;
  uVar8 = uVar8 ^ local_f8[0];
  uVar9 = uVar8 << 0x19 | uVar8 >> 7;
  uVar8 = uVar15 + uVar11 + local_98[2];
  uVar12 = uVar12 ^ uVar8;
  uVar6 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_f8[1] = local_f8[1] + uVar6;
  uVar11 = uVar11 ^ local_f8[1];
  uVar12 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar15 = uVar8 + uVar12 + local_98[10];
  uVar6 = uVar6 ^ uVar15;
  uVar10 = uVar6 << 0x18 | uVar6 >> 8;
  local_f8[1] = local_f8[1] + uVar10;
  uVar12 = uVar12 ^ local_f8[1];
  uVar6 = uVar12 << 0x19 | uVar12 >> 7;
  uVar3 = local_98[6] + uVar6 + uVar3;
  uVar13 = uVar13 ^ uVar3;
  uVar12 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[0] = local_f8[0] + uVar12;
  uVar6 = uVar6 ^ local_f8[0];
  uVar8 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar6 = uVar3 + local_98[0xf] + uVar8;
  uVar12 = uVar12 ^ uVar6;
  uVar13 = uVar12 << 0x18 | uVar12 >> 8;
  local_f8[0] = uVar13 + local_f8[0];
  uVar8 = local_f8[0] ^ uVar8;
  uVar11 = uVar8 << 0x19 | uVar8 >> 7;
  uVar3 = uVar4 + uVar2 + local_98[0xe];
  uVar7 = uVar7 ^ uVar3;
  uVar4 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[1] = local_f8[1] + uVar4;
  uVar2 = uVar2 ^ local_f8[1];
  uVar2 = uVar2 << 0x14 | uVar2 >> 0xc;
  uVar3 = uVar3 + uVar2 + local_98[9];
  uVar4 = uVar4 ^ uVar3;
  uVar8 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[1] = uVar8 + local_f8[1];
  uVar2 = local_f8[1] ^ uVar2;
  uVar12 = uVar2 << 0x19 | uVar2 >> 7;
  uVar7 = uVar16 + uVar5 + local_98[0xb];
  uVar10 = uVar10 ^ uVar7;
  uVar4 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[2] = local_f8[2] + uVar4;
  uVar5 = uVar5 ^ local_f8[2];
  uVar2 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar16 = uVar7 + uVar2 + local_98[3];
  uVar4 = uVar4 ^ uVar16;
  uVar10 = uVar4 << 0x18 | uVar4 >> 8;
  local_f8[2] = uVar10 + local_f8[2];
  uVar2 = uVar2 ^ local_f8[2];
  uVar4 = uVar2 << 0x19 | uVar2 >> 7;
  uVar7 = uVar15 + uVar9 + local_98[0];
  uVar14 = uVar14 ^ uVar7;
  uVar5 = uVar14 << 0x10 | uVar14 >> 0x10;
  local_f8[3] = local_f8[3] + uVar5;
  uVar9 = uVar9 ^ local_f8[3];
  uVar2 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar14 = uVar7 + uVar2 + local_98[8];
  uVar5 = uVar5 ^ uVar14;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_f8[3] = local_f8[3] + uVar5;
  uVar2 = uVar2 ^ local_f8[3];
  uVar9 = uVar2 << 0x19 | uVar2 >> 7;
  uVar2 = uVar6 + uVar12 + local_98[0xc];
  uVar5 = uVar5 ^ uVar2;
  uVar6 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_f8[2] = local_f8[2] + uVar6;
  uVar12 = uVar12 ^ local_f8[2];
  uVar5 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar12 = uVar2 + uVar5 + local_98[2];
  uVar6 = uVar6 ^ uVar12;
  uVar7 = uVar6 << 0x18 | uVar6 >> 8;
  local_f8[2] = uVar7 + local_f8[2];
  uVar5 = local_f8[2] ^ uVar5;
  uVar2 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + uVar4 + local_98[0xd];
  uVar13 = uVar13 ^ uVar3;
  uVar6 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[3] = local_f8[3] + uVar6;
  uVar4 = uVar4 ^ local_f8[3];
  uVar5 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar4 = uVar3 + uVar5 + local_98[7];
  uVar6 = uVar6 ^ uVar4;
  uVar13 = uVar6 << 0x18 | uVar6 >> 8;
  local_f8[3] = local_f8[3] + uVar13;
  uVar5 = local_f8[3] ^ uVar5;
  uVar6 = uVar5 << 0x19 | uVar5 >> 7;
  uVar15 = uVar16 + uVar9 + local_98[1];
  uVar8 = uVar8 ^ uVar15;
  uVar3 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_f8[0] = local_f8[0] + uVar3;
  uVar9 = uVar9 ^ local_f8[0];
  uVar5 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar15 = uVar15 + local_98[4] + uVar5;
  uVar3 = uVar3 ^ uVar15;
  uVar9 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[0] = local_f8[0] + uVar9;
  uVar5 = uVar5 ^ local_f8[0];
  uVar8 = uVar5 << 0x19 | uVar5 >> 7;
  uVar5 = uVar14 + uVar11 + local_98[10];
  uVar10 = uVar10 ^ uVar5;
  uVar3 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar11 = uVar11 ^ local_f8[1];
  uVar10 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar14 = uVar5 + uVar10 + local_98[5];
  uVar3 = uVar3 ^ uVar14;
  uVar11 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[1] + uVar11;
  uVar10 = uVar10 ^ local_f8[1];
  uVar5 = uVar10 << 0x19 | uVar10 >> 7;
  uVar12 = local_98[10] + uVar5 + uVar12;
  uVar13 = uVar13 ^ uVar12;
  uVar3 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_f8[0] = local_f8[0] + uVar3;
  uVar5 = uVar5 ^ local_f8[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar12 + uVar5 + local_98[2];
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[0] = uVar3 + local_f8[0];
  uVar5 = local_f8[0] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar4 = uVar4 + uVar2 + local_98[8];
  uVar9 = uVar9 ^ uVar4;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_f8[1] = local_f8[1] + uVar9;
  uVar2 = uVar2 ^ local_f8[1];
  uVar2 = uVar2 << 0x14 | uVar2 >> 0xc;
  uVar12 = uVar4 + local_98[4] + uVar2;
  uVar9 = uVar9 ^ uVar12;
  uVar4 = uVar9 << 0x18 | uVar9 >> 8;
  local_f8[1] = uVar4 + local_f8[1];
  uVar2 = local_f8[1] ^ uVar2;
  uVar9 = uVar2 << 0x19 | uVar2 >> 7;
  uVar13 = uVar15 + uVar6 + local_98[7];
  uVar11 = uVar11 ^ uVar13;
  uVar2 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_f8[2] = local_f8[2] + uVar2;
  uVar6 = uVar6 ^ local_f8[2];
  uVar11 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar13 + uVar11 + local_98[6];
  uVar2 = uVar2 ^ uVar15;
  uVar6 = uVar2 << 0x18 | uVar2 >> 8;
  uVar13 = uVar14 + uVar8 + local_98[1];
  uVar7 = uVar7 ^ uVar13;
  uVar2 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_f8[3] = local_f8[3] + uVar2;
  uVar8 = uVar8 ^ local_f8[3];
  uVar7 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar13 = uVar13 + uVar7 + local_98[5];
  local_f8[2] = uVar6 + local_f8[2];
  uVar2 = uVar2 ^ uVar13;
  uVar2 = uVar2 << 0x18 | uVar2 >> 8;
  uVar11 = uVar11 ^ local_f8[2];
  uVar10 = uVar10 + uVar9 + local_98[0xf];
  local_f8[3] = local_f8[3] + uVar2;
  uVar2 = uVar2 ^ uVar10;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  local_f8[2] = local_f8[2] + uVar2;
  uVar9 = uVar9 ^ local_f8[2];
  uVar8 = uVar9 << 0x14 | uVar9 >> 0xc;
  local_118[0] = uVar10 + uVar8 + local_98[0xb];
  uVar2 = local_118[0] ^ uVar2;
  local_f8[7] = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[2] = local_f8[7] + local_f8[2];
  uVar9 = uVar11 << 0x19 | uVar11 >> 7;
  local_f8[2] = local_f8[2] ^ uVar8;
  uVar7 = uVar7 ^ local_f8[3];
  local_118[5] = local_f8[2] << 0x19 | local_f8[2] >> 7;
  uVar12 = uVar12 + uVar9 + local_98[9];
  uVar3 = uVar3 ^ uVar12;
  uVar2 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_f8[3] = local_f8[3] + uVar2;
  uVar9 = uVar9 ^ local_f8[3];
  uVar8 = uVar9 << 0x14 | uVar9 >> 0xc;
  local_118[1] = uVar12 + uVar8 + local_98[0xe];
  uVar2 = local_118[1] ^ uVar2;
  local_f8[4] = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[3] = local_f8[4] + local_f8[3];
  uVar3 = uVar7 << 0x19 | uVar7 >> 7;
  local_f8[3] = local_f8[3] ^ uVar8;
  local_118[6] = local_f8[3] << 0x19 | local_f8[3] >> 7;
  uVar12 = uVar15 + uVar3 + local_98[3];
  uVar4 = uVar4 ^ uVar12;
  uVar2 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_f8[0] = local_f8[0] + uVar2;
  uVar3 = uVar3 ^ local_f8[0];
  uVar3 = uVar3 << 0x14 | uVar3 >> 0xc;
  local_118[2] = uVar12 + uVar3 + local_98[0xc];
  uVar2 = local_118[2] ^ uVar2;
  local_f8[5] = uVar2 << 0x18 | uVar2 >> 8;
  local_f8[0] = local_f8[5] + local_f8[0];
  local_f8[0] = local_f8[0] ^ uVar3;
  local_118[7] = local_f8[0] << 0x19 | local_f8[0] >> 7;
  uVar4 = uVar13 + uVar5 + local_98[0xd];
  uVar6 = uVar6 ^ uVar4;
  uVar3 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_f8[1] = local_f8[1] + uVar3;
  uVar5 = uVar5 ^ local_f8[1];
  uVar2 = uVar5 << 0x14 | uVar5 >> 0xc;
  local_118[3] = uVar4 + uVar2 + local_98[0];
  uVar3 = local_118[3] ^ uVar3;
  local_f8[6] = uVar3 << 0x18 | uVar3 >> 8;
  local_f8[1] = local_f8[6] + local_f8[1];
  local_f8[1] = local_f8[1] ^ uVar2;
  local_118[4] = local_f8[1] << 0x19 | local_f8[1] >> 7;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = local_118[lVar1] ^ S->h[lVar1] ^ local_f8[lVar1];
  }
  return;
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}